

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O3

void cfl_predict_lbd_32x16_ssse3(int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint8_t *puVar3;
  undefined1 auVar4 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  undefined1 auVar8 [16];
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  undefined1 auVar26 [16];
  
  auVar4 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  auVar5 = pabsw(in_XMM1,auVar4);
  auVar5 = psllw(auVar5,9);
  auVar6 = pshuflw(ZEXT116(*dst),ZEXT116(*dst),0);
  puVar3 = dst + 0x10;
  uVar2 = 0xffffffffffffffc0;
  do {
    auVar8 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x40);
    auVar1 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x50);
    auVar26 = psignw(auVar4,auVar8);
    auVar8 = pabsw(auVar8,auVar8);
    auVar8 = pmulhrsw(auVar8,auVar5);
    auVar8 = psignw(auVar8,auVar26);
    sVar23 = auVar6._0_2_;
    sVar7 = auVar8._0_2_ + sVar23;
    sVar25 = auVar6._2_2_;
    sVar9 = auVar8._2_2_ + sVar25;
    sVar10 = auVar8._4_2_ + sVar23;
    sVar11 = auVar8._6_2_ + sVar25;
    sVar12 = auVar8._8_2_ + sVar23;
    sVar13 = auVar8._10_2_ + sVar25;
    sVar14 = auVar8._12_2_ + sVar23;
    sVar15 = auVar8._14_2_ + sVar25;
    auVar26 = psignw(auVar4,auVar1);
    auVar8 = pabsw(auVar1,auVar1);
    auVar8 = pmulhrsw(auVar8,auVar5);
    auVar8 = psignw(auVar8,auVar26);
    sVar16 = auVar8._0_2_ + sVar23;
    sVar17 = auVar8._2_2_ + sVar25;
    sVar18 = auVar8._4_2_ + sVar23;
    sVar19 = auVar8._6_2_ + sVar25;
    sVar20 = auVar8._8_2_ + sVar23;
    sVar21 = auVar8._10_2_ + sVar25;
    sVar22 = auVar8._12_2_ + sVar23;
    sVar24 = auVar8._14_2_ + sVar25;
    puVar3[-0x10] = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    puVar3[-0xf] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    puVar3[-0xe] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    puVar3[-0xd] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    puVar3[-0xc] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    puVar3[-0xb] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    puVar3[-10] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    puVar3[-9] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    puVar3[-8] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    puVar3[-7] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    puVar3[-6] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    puVar3[-5] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    puVar3[-4] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    puVar3[-3] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    puVar3[-2] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    puVar3[-1] = (0 < sVar24) * (sVar24 < 0x100) * (char)sVar24 - (0xff < sVar24);
    auVar8 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x60);
    auVar1 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x70);
    auVar26 = psignw(auVar4,auVar8);
    auVar8 = pabsw(auVar8,auVar8);
    auVar8 = pmulhrsw(auVar8,auVar5);
    auVar8 = psignw(auVar8,auVar26);
    sVar7 = auVar8._0_2_ + sVar23;
    sVar9 = auVar8._2_2_ + sVar25;
    sVar10 = auVar8._4_2_ + sVar23;
    sVar11 = auVar8._6_2_ + sVar25;
    sVar12 = auVar8._8_2_ + sVar23;
    sVar13 = auVar8._10_2_ + sVar25;
    sVar14 = auVar8._12_2_ + sVar23;
    sVar15 = auVar8._14_2_ + sVar25;
    auVar26 = psignw(auVar4,auVar1);
    auVar8 = pabsw(auVar1,auVar1);
    auVar8 = pmulhrsw(auVar8,auVar5);
    auVar8 = psignw(auVar8,auVar26);
    sVar16 = auVar8._0_2_ + sVar23;
    sVar17 = auVar8._2_2_ + sVar25;
    sVar18 = auVar8._4_2_ + sVar23;
    sVar19 = auVar8._6_2_ + sVar25;
    sVar20 = auVar8._8_2_ + sVar23;
    sVar21 = auVar8._10_2_ + sVar25;
    sVar23 = auVar8._12_2_ + sVar23;
    sVar25 = auVar8._14_2_ + sVar25;
    *puVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)sVar7 - (0xff < sVar7);
    puVar3[1] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    puVar3[2] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    puVar3[3] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    puVar3[4] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    puVar3[5] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    puVar3[6] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    puVar3[7] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    puVar3[8] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    puVar3[9] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    puVar3[10] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    puVar3[0xb] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    puVar3[0xc] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    puVar3[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    puVar3[0xe] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
    puVar3[0xf] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
    uVar2 = uVar2 + 0x40;
    puVar3 = puVar3 + dst_stride;
  } while (uVar2 < 0x3c0);
  return;
}

Assistant:

static inline void cfl_predict_lbd_ssse3(const int16_t *pred_buf_q3,
                                         uint8_t *dst, int dst_stride,
                                         int alpha_q3, int width, int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    if (width < 16) {
      res = _mm_packus_epi16(res, res);
      if (width == 4)
        _mm_storeh_epi32((__m128i *)dst, res);
      else
        _mm_storel_epi64((__m128i *)dst, res);
    } else {
      __m128i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      res = _mm_packus_epi16(res, next);
      _mm_storeu_si128((__m128i *)dst, res);
      if (width == 32) {
        res = predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
        next = predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
        res = _mm_packus_epi16(res, next);
        _mm_storeu_si128((__m128i *)(dst + 16), res);
      }
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}